

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::register_if_negatedcharclass
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,state_type *atom)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_30 [8];
  range_pairs ranges;
  state_type *atom_local;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  ranges.rparray_.capacity_ = (size_type)atom;
  bVar1 = re_state::is_negcharclass(atom);
  if (bVar1) {
    range_pairs::range_pairs((range_pairs *)local_30);
    add_predefclass_to_charclass
              (this,(range_pairs *)local_30,(state_type *)ranges.rparray_.capacity_);
    uVar2 = re_character_class::register_newclass
                      (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).
                        character_class,(range_pairs *)local_30);
    *(uint *)ranges.rparray_.capacity_ = uVar2;
    *(undefined1 *)(ranges.rparray_.capacity_ + 0x24) = 0;
    range_pairs::~range_pairs((range_pairs *)local_30);
  }
  return true;
}

Assistant:

bool register_if_negatedcharclass(state_type &atom)
	{
		if (atom.is_negcharclass())
		{
			range_pairs ranges;

			add_predefclass_to_charclass(ranges, atom);
			atom.number = this->character_class.register_newclass(ranges);
			atom.is_not = false;
		}
		return true;
	}